

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O3

void __thiscall
NNTreeIterator::resetLimits(NNTreeIterator *this,QPDFObjectHandle *node,iterator parent)

{
  NNTreeDetails *pNVar1;
  QPDF *qpdf;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle ofirst;
  QPDFObjectHandle first_limits;
  QPDFObjectHandle last_kid;
  QPDFObjectHandle first_kid;
  QPDFObjectHandle last_limits;
  QPDFObjectHandle items;
  QPDFObjectHandle kids;
  undefined1 local_158 [40];
  NNTreeIterator *local_130;
  QPDFObjectHandle local_128;
  QPDFObjectHandle local_118;
  QPDFObjectHandle local_108;
  undefined1 local_f0 [32];
  _List_node_base *local_d0;
  QPDFObjectHandle local_c8;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_58;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  local_d0 = (_List_node_base *)&this->path;
  local_58 = &(node->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_130 = this;
  do {
    if (parent._M_node == local_d0) {
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/Limits","");
      QPDFObjectHandle::removeKey(node,(string *)local_158);
      if ((element_type *)local_158._0_8_ == (element_type *)(local_158 + 0x10)) {
        return;
      }
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      return;
    }
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/Kids","");
    QPDFObjectHandle::getKey(&local_40,(string *)node);
    if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    bVar3 = QPDFObjectHandle::isArray(&local_40);
    iVar5 = 0;
    if (bVar3) {
      iVar5 = QPDFObjectHandle::getArrayNItems(&local_40);
    }
    (*(code *)**(undefined8 **)local_130->impl->details)();
    QPDFObjectHandle::getKey(&local_50,(string *)node);
    bVar3 = QPDFObjectHandle::isArray(&local_50);
    if (bVar3) {
      iVar6 = QPDFObjectHandle::getArrayNItems(&local_50);
      local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (iVar6 < 2) goto LAB_0012b9ba;
      iVar5 = (int)&local_50;
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_158,iVar5);
      _Var2._M_pi = local_108.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
      local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_158._0_8_;
      local_158._0_8_ = (element_type *)0x0;
      local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
      }
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_158,iVar5);
      _Var2._M_pi = local_118.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
      local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_158._0_8_;
      local_158._0_8_ = (element_type *)0x0;
      local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
        goto LAB_0012bbb5;
      }
    }
    else {
LAB_0012b9ba:
      local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      if (0 < iVar5) {
        iVar5 = (int)&local_40;
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)(local_f0 + 0x10),iVar5);
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_f0,iVar5);
        bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_f0 + 0x10));
        if ((bVar3) && (bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_f0), bVar3)
           ) {
          local_158._0_8_ = local_158 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/Limits","");
          QPDFObjectHandle::getKey(&local_128,(string *)(local_f0 + 0x10));
          if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          local_158._0_8_ = local_158 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/Limits","");
          QPDFObjectHandle::getKey(&local_c8,(string *)local_f0);
          if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          bVar3 = QPDFObjectHandle::isArray(&local_128);
          if ((((bVar3) && (iVar5 = QPDFObjectHandle::getArrayNItems(&local_128), 1 < iVar5)) &&
              (bVar3 = QPDFObjectHandle::isArray(&local_c8), bVar3)) &&
             (iVar5 = QPDFObjectHandle::getArrayNItems(&local_c8), 1 < iVar5)) {
            QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_158,(int)&local_128);
            _Var2._M_pi = local_108.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi;
            local_108.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
            local_108.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_158._0_8_;
            local_158._0_8_ = (element_type *)0x0;
            local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
            }
            QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_158,(int)&local_d0 + 8);
            _Var2._M_pi = local_118.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi;
            local_118.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
            local_118.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_158._0_8_;
            local_158._0_8_ = (element_type *)0x0;
            local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
            }
          }
          if (local_c8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (local_128.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_;
        }
LAB_0012bbb5:
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
    }
    if ((local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr == (element_type *)0x0) ||
       (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0)) {
      qpdf = local_130->impl->qpdf;
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,"unable to determine limits","");
      warn(qpdf,node,(string *)local_158);
      if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
LAB_0012bff1:
      if (parent._M_node == local_d0->_M_next) goto LAB_0012c01e;
      (node->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)parent._M_node[1]._M_next;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (local_58,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent._M_node[1]._M_prev);
      parent._M_node = (parent._M_node)->_M_prev;
      bVar3 = false;
    }
    else {
      QPDFObjectHandle::newArray();
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)(local_f0 + 0x10),&local_108);
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)(local_f0 + 0x10),&local_118);
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/Limits","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_f0,(string *)node);
      if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_f0);
      if ((!bVar3) ||
         (iVar5 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_f0), iVar5 != 2)) {
LAB_0012bf83:
        local_158._0_8_ = local_158 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/Limits","");
        QPDFObjectHandle::replaceKey(node,(string *)local_158,(QPDFObjectHandle *)(local_f0 + 0x10))
        ;
        if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_);
        }
        goto LAB_0012bff1;
      }
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_158,(int)local_f0);
      QVar7 = QPDFObjectHandle::getArrayItem(&local_128,(int)local_f0);
      pNVar1 = local_130->impl->details;
      local_68 = (element_type *)local_158._0_8_;
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
        }
      }
      cVar4 = (**(code **)(*(long *)pNVar1 + 8))
                        (pNVar1,&local_68,
                         QVar7.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
      if (cVar4 == '\0') {
        bVar3 = false;
      }
      else {
        pNVar1 = local_130->impl->details;
        local_78 = local_128.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_70 = local_128.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_128.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_128.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_128.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_128.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_128.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        cVar4 = (**(code **)(*(long *)pNVar1 + 8))(pNVar1,&local_78);
        if (cVar4 == '\0') {
          bVar3 = false;
        }
        else {
          pNVar1 = local_130->impl->details;
          local_88 = local_108.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_80 = local_108.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_108.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_108.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_108.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_108.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_108.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_98 = (element_type *)local_158._0_8_;
          local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
            }
          }
          iVar5 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_88,&local_98);
          if (iVar5 == 0) {
            pNVar1 = local_130->impl->details;
            local_a8 = local_118.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_a0 = local_118.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_118.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_118.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_118.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_118.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_118.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_b8 = local_128.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_b0 = local_128.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_128.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_128.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_128.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_128.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_128.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            iVar5 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_a8,&local_b8);
            bVar3 = iVar5 == 0;
            if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
            }
            if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
            }
          }
          else {
            bVar3 = false;
          }
          if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
        }
        if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
        }
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      if (local_128.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
      }
      if (!bVar3) goto LAB_0012bf83;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_);
      }
LAB_0012c01e:
      bVar3 = true;
    }
    if (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void
NNTreeIterator::resetLimits(QPDFObjectHandle node, std::list<PathElement>::iterator parent)
{
    bool done = false;
    while (!done) {
        if (parent == this->path.end()) {
            QTC::TC("qpdf", "NNTree remove limits from root");
            node.removeKey("/Limits");
            done = true;
            break;
        }
        auto kids = node.getKey("/Kids");
        int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
        auto items = node.getKey(impl.details.itemsKey());
        int nitems = items.isArray() ? items.getArrayNItems() : 0;

        bool changed = true;
        QPDFObjectHandle first;
        QPDFObjectHandle last;
        if (nitems >= 2) {
            first = items.getArrayItem(0);
            last = items.getArrayItem((nitems - 1) & ~1);
        } else if (nkids > 0) {
            auto first_kid = kids.getArrayItem(0);
            auto last_kid = kids.getArrayItem(nkids - 1);
            if (first_kid.isDictionary() && last_kid.isDictionary()) {
                auto first_limits = first_kid.getKey("/Limits");
                auto last_limits = last_kid.getKey("/Limits");
                if (first_limits.isArray() && (first_limits.getArrayNItems() >= 2) &&
                    last_limits.isArray() && (last_limits.getArrayNItems() >= 2)) {
                    first = first_limits.getArrayItem(0);
                    last = last_limits.getArrayItem(1);
                }
            }
        }
        if (first && last) {
            auto limits = QPDFObjectHandle::newArray();
            limits.appendItem(first);
            limits.appendItem(last);
            auto olimits = node.getKey("/Limits");
            if (olimits.isArray() && (olimits.getArrayNItems() == 2)) {
                auto ofirst = olimits.getArrayItem(0);
                auto olast = olimits.getArrayItem(1);
                if (impl.details.keyValid(ofirst) && impl.details.keyValid(olast) &&
                    (impl.details.compareKeys(first, ofirst) == 0) &&
                    (impl.details.compareKeys(last, olast) == 0)) {
                    QTC::TC("qpdf", "NNTree limits didn't change");
                    changed = false;
                }
            }
            if (changed) {
                node.replaceKey("/Limits", limits);
            }
        } else {
            QTC::TC("qpdf", "NNTree unable to determine limits");
            warn(impl.qpdf, node, "unable to determine limits");
        }

        if ((!changed) || (parent == this->path.begin())) {
            done = true;
        } else {
            node = parent->node;
            --parent;
        }
    }
}